

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int * __thiscall ImGuiStorage::GetIntRef(ImGuiStorage *this,ImGuiID key,int default_val)

{
  ImGuiStoragePair *it_00;
  ImGuiStoragePair *pIVar1;
  ImGuiStoragePair *pIVar2;
  ImGuiStoragePair local_30;
  ImGuiStoragePair *local_20;
  ImGuiStoragePair *it;
  int default_val_local;
  ImGuiID key_local;
  ImGuiStorage *this_local;
  
  it._0_4_ = default_val;
  it._4_4_ = key;
  _default_val_local = this;
  pIVar1 = LowerBound(&this->Data,key);
  local_20 = pIVar1;
  pIVar2 = ImVector<ImGuiStorage::ImGuiStoragePair>::end
                     ((ImVector<ImGuiStorage::ImGuiStoragePair> *)this);
  it_00 = local_20;
  if ((pIVar1 == pIVar2) || (local_20->key != it._4_4_)) {
    ImGuiStoragePair::ImGuiStoragePair((ImGuiStoragePair *)&local_30,it._4_4_,(int)it);
    local_20 = ImVector<ImGuiStorage::ImGuiStoragePair>::insert
                         ((ImVector<ImGuiStorage::ImGuiStoragePair> *)this,it_00,&local_30);
  }
  return (int *)&local_20->field_1;
}

Assistant:

int* ImGuiStorage::GetIntRef(ImGuiID key, int default_val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, ImGuiStoragePair(key, default_val));
    return &it->val_i;
}